

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O3

bool duckdb::CSVMultiFileInfo::TryInitializeScan
               (ClientContext *context,shared_ptr<duckdb::BaseFileReader,_true> *reader,
               GlobalTableFunctionState *gstate_p,LocalTableFunctionState *lstate_p)

{
  vector<unsigned_long,_true> *pvVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  shared_ptr<duckdb::CSVFileScan,_true> csv_reader_ptr;
  _Head_base<0UL,_duckdb::StringValueScanner_*,_false> local_40;
  undefined1 local_38 [16];
  MultiFileBindData *local_28;
  duckdb local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_38._8_8_ =
       (reader->internal).super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_28 = (MultiFileBindData *)
             (reader->internal).
             super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_28 != (MultiFileBindData *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &(local_28->super_TableFunctionData).column_ids;
      *(int *)&(pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &(local_28->super_TableFunctionData).column_ids;
      *(int *)&(pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
    }
  }
  shared_ptr_cast<duckdb::BaseFileReader,duckdb::CSVFileScan>
            (local_20,(shared_ptr<duckdb::BaseFileReader,_true> *)(local_38 + 8));
  if (local_28 != (MultiFileBindData *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  local_40._M_head_impl = (StringValueScanner *)lstate_p[1]._vptr_LocalTableFunctionState;
  lstate_p[1]._vptr_LocalTableFunctionState = (_func_int **)0x0;
  CSVGlobalState::FinishScan
            ((CSVGlobalState *)gstate_p,
             (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
              *)&local_40);
  if (local_40._M_head_impl != (StringValueScanner *)0x0) {
    (*((local_40._M_head_impl)->super_BaseScanner)._vptr_BaseScanner[1])();
  }
  local_40._M_head_impl = (StringValueScanner *)0x0;
  CSVGlobalState::Next((CSVGlobalState *)local_38,(shared_ptr<duckdb::CSVFileScan,_true> *)gstate_p)
  ;
  uVar3 = local_38._0_8_;
  local_38._0_8_ = (_func_int **)0x0;
  pp_Var2 = lstate_p[1]._vptr_LocalTableFunctionState;
  lstate_p[1]._vptr_LocalTableFunctionState = (_func_int **)uVar3;
  if (pp_Var2 != (_func_int **)0x0) {
    (**(code **)(*pp_Var2 + 8))();
    if ((_func_int **)local_38._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_38._0_8_ + 8))();
    }
  }
  pp_Var2 = lstate_p[1]._vptr_LocalTableFunctionState;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return pp_Var2 != (_func_int **)0x0;
}

Assistant:

bool CSVMultiFileInfo::TryInitializeScan(ClientContext &context, shared_ptr<BaseFileReader> &reader,
                                         GlobalTableFunctionState &gstate_p, LocalTableFunctionState &lstate_p) {
	auto &gstate = gstate_p.Cast<CSVGlobalState>();
	auto &lstate = lstate_p.Cast<CSVLocalState>();
	auto csv_reader_ptr = shared_ptr_cast<BaseFileReader, CSVFileScan>(reader);
	gstate.FinishScan(std::move(lstate.csv_reader));
	lstate.csv_reader = gstate.Next(csv_reader_ptr);
	if (!lstate.csv_reader) {
		// exhausted the scan
		return false;
	}
	return true;
}